

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSExporter::WriteMeshes(Discreet3DSExporter *this)

{
  StreamWriterLE *writer;
  pointer pcVar1;
  aiMesh *mesh;
  aiVector3D *paVar2;
  aiFace *paVar3;
  mapped_type *this_00;
  float *pfVar4;
  _Rb_tree_node_base *p_Var5;
  unsigned_short f;
  uint c;
  long lVar6;
  uint i;
  ulong uVar7;
  aiNode *in_R8;
  uint j;
  uint r;
  uint uVar8;
  aiVector3t<float> aVar9;
  ChunkWriter chunk_1;
  float fStack_94;
  ChunkWriter chunk2;
  ChunkWriter chunk;
  string local_50;
  
  writer = &this->writer;
  for (p_Var5 = (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->meshes)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    pcVar1 = *(pointer *)(p_Var5 + 1);
    uVar8 = *(uint *)&p_Var5[1]._M_parent;
    mesh = this->scene->mMeshes[(long)(ulong)uVar8];
    local_50._M_dataplus._M_p = pcVar1;
    this_00 = std::
              map<const_aiNode_*,_aiMatrix4x4t<float>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
              ::operator[](&this->trafos,(key_type *)&local_50);
    anon_unknown_0::ChunkWriter::ChunkWriter(&chunk,writer,0x4000);
    (anonymous_namespace)::GetMeshName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)mesh,(aiMesh *)(ulong)uVar8,(uint)pcVar1,in_R8);
    WriteString(this,&local_50);
    anon_unknown_0::ChunkWriter::ChunkWriter(&chunk2,writer,0x4100);
    anon_unknown_0::ChunkWriter::ChunkWriter(&chunk_1,writer,0x4110);
    StreamWriter<false,_false>::Put<unsigned_short>(writer,(unsigned_short)mesh->mNumVertices);
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < mesh->mNumVertices; uVar7 = uVar7 + 1) {
      aVar9 = ::operator*(this_00,(aiVector3t<float> *)((long)&mesh->mVertices->x + lVar6));
      StreamWriter<false,_false>::Put<float>(writer,aVar9.x);
      fStack_94 = aVar9.y;
      StreamWriter<false,_false>::Put<float>(writer,fStack_94);
      StreamWriter<false,_false>::Put<float>(writer,aVar9.z);
      lVar6 = lVar6 + 0xc;
    }
    anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk_1);
    if ((mesh->mTextureCoords[0] != (aiVector3D *)0x0) && (mesh->mNumVertices != 0)) {
      anon_unknown_0::ChunkWriter::ChunkWriter(&chunk_1,writer,0x4140);
      StreamWriter<false,_false>::Put<unsigned_short>(writer,(unsigned_short)mesh->mNumVertices);
      lVar6 = 4;
      for (uVar7 = 0; uVar7 < mesh->mNumVertices; uVar7 = uVar7 + 1) {
        paVar2 = mesh->mTextureCoords[0];
        StreamWriter<false,_false>::Put<float>(writer,*(float *)((long)paVar2 + lVar6 + -4));
        StreamWriter<false,_false>::Put<float>(writer,*(float *)((long)&paVar2->x + lVar6));
        lVar6 = lVar6 + 0xc;
      }
      anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk_1);
    }
    anon_unknown_0::ChunkWriter::ChunkWriter(&chunk_1,writer,0x4120);
    f = 0;
    for (lVar6 = 0; (ulong)mesh->mNumFaces << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      f = (f + 1) - (ushort)(*(uint *)((long)&mesh->mFaces->mNumIndices + lVar6) < 3);
    }
    StreamWriter<false,_false>::Put<unsigned_short>(writer,f);
    for (uVar7 = 0; uVar7 < mesh->mNumFaces; uVar7 = uVar7 + 1) {
      paVar3 = mesh->mFaces;
      if (2 < paVar3[uVar7].mNumIndices) {
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          StreamWriter<false,_false>::Put<short>(writer,(short)paVar3[uVar7].mIndices[lVar6]);
        }
        StreamWriter<false,_false>::Put<short>(writer,0);
      }
    }
    WriteFaceMaterialChunk(this,mesh);
    anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk_1);
    anon_unknown_0::ChunkWriter::ChunkWriter(&chunk_1,writer,0x4160);
    for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        pfVar4 = aiMatrix4x4t<float>::operator[](this_00,uVar8);
        StreamWriter<false,_false>::Put<float>(writer,pfVar4[lVar6]);
      }
    }
    anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk_1);
    anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk2);
    std::__cxx11::string::~string((string *)&local_50);
    anon_unknown_0::ChunkWriter::~ChunkWriter(&chunk);
  }
  return;
}

Assistant:

void Discreet3DSExporter::WriteMeshes()
{
    // NOTE: 3DS allows for instances. However:
    //   i)  not all importers support reading them
    //   ii) instances are not as flexible as they are in assimp, in particular,
    //        nodes can carry (and instance) only one mesh.
    //
    // This exporter currently deep clones all instanced meshes, i.e. for each mesh
    // attached to a node a full TRIMESH chunk is written to the file.
    //
    // Furthermore, the TRIMESH is transformed into world space so that it will
    // appear correctly if importers don't read the scene hierarchy at all.
    for (MeshesByNodeMap::const_iterator it = meshes.begin(); it != meshes.end(); ++it) {
        const aiNode& node = *(*it).first;
        const unsigned int mesh_idx = (*it).second;

        const aiMesh& mesh = *scene->mMeshes[mesh_idx];

        // This should not happen if the SLM step is correctly executed
        // before the scene is handed to the exporter
        ai_assert(mesh.mNumVertices <= 0xffff);
        ai_assert(mesh.mNumFaces <= 0xffff);

        const aiMatrix4x4& trafo = trafos[&node];

        ChunkWriter chunk(writer, Discreet3DS::CHUNK_OBJBLOCK);

        // Mesh name is tied to the node it is attached to so it can later be referenced
        const std::string& name = GetMeshName(mesh, mesh_idx, node);
        WriteString(name);


        // TRIMESH chunk
        ChunkWriter chunk2(writer, Discreet3DS::CHUNK_TRIMESH);

        // Vertices in world space
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_VERTLIST);

            const uint16_t count = static_cast<uint16_t>(mesh.mNumVertices);
            writer.PutU2(count);
            for (unsigned int i = 0; i < mesh.mNumVertices; ++i) {
                const aiVector3D& v = trafo * mesh.mVertices[i];
                writer.PutF4(v.x);
                writer.PutF4(v.y);
                writer.PutF4(v.z);
            }
        }

        // UV coordinates
        if (mesh.HasTextureCoords(0)) {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_MAPLIST);
            const uint16_t count = static_cast<uint16_t>(mesh.mNumVertices);
            writer.PutU2(count);

            for (unsigned int i = 0; i < mesh.mNumVertices; ++i) {
                const aiVector3D& v = mesh.mTextureCoords[0][i];
                writer.PutF4(v.x);
                writer.PutF4(v.y);
            }
        }

        // Faces (indices)
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_FACELIST);

            ai_assert(mesh.mNumFaces <= 0xffff);

            // Count triangles, discard lines and points
            uint16_t count = 0;
            for (unsigned int i = 0; i < mesh.mNumFaces; ++i) {
                const aiFace& f = mesh.mFaces[i];
                if (f.mNumIndices < 3) {
                    continue;
                }
                // TRIANGULATE step is a pre-requisite so we should not see polys here
                ai_assert(f.mNumIndices == 3);
                ++count;
            }

            writer.PutU2(count);
            for (unsigned int i = 0; i < mesh.mNumFaces; ++i) {
                const aiFace& f = mesh.mFaces[i];
                if (f.mNumIndices < 3) {
                    continue;
                }

                for (unsigned int j = 0; j < 3; ++j) {
                    ai_assert(f.mIndices[j] <= 0xffff);
                    writer.PutI2(static_cast<uint16_t>(f.mIndices[j]));
                }

                // Edge visibility flag
                writer.PutI2(0x0);
            }

            // TODO: write smoothing groups (CHUNK_SMOOLIST)

            WriteFaceMaterialChunk(mesh);
        }

        // Transformation matrix by which the mesh vertices have been pre-transformed with.
        {
            ChunkWriter chunk(writer, Discreet3DS::CHUNK_TRMATRIX);
            for (unsigned int r = 0; r < 4; ++r) {
                for (unsigned int c = 0; c < 3; ++c) {
                    writer.PutF4(trafo[r][c]);
                }
            }
        }
    }
}